

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::Synth::writeSysexGlobal(Synth *this,Bit32u addr,Bit8u *sysex,Bit32u len)

{
  Bit32u len_00;
  uint uVar1;
  MemoryRegion *region;
  uint uVar2;
  
  while( true ) {
    region = findMemoryRegion(this,addr);
    if (region == (MemoryRegion *)0x0) {
      printDebug(this,"Sysex write to unrecognised address %06x, len %d",
                 (ulong)((addr & 0x7f) + (addr & 0x3f80) * 2 + (addr & 0x1fc000) * 4),(ulong)len);
      return;
    }
    uVar1 = region->entries * region->entrySize + region->startAddr;
    len_00 = uVar1 - addr;
    if (addr + len <= uVar1) {
      len_00 = len;
    }
    writeMemoryRegion(this,region,addr,len_00,sysex);
    uVar1 = region->entries * region->entrySize + region->startAddr;
    if (addr + len <= uVar1) break;
    uVar2 = uVar1 - addr;
    if (uVar2 == 0) {
      return;
    }
    sysex = sysex + uVar2;
    len = len - uVar2;
    addr = uVar1;
  }
  return;
}

Assistant:

void Synth::writeSysexGlobal(Bit32u addr, const Bit8u *sysex, Bit32u len) {
	for (;;) {
		// Find the appropriate memory region
		const MemoryRegion *region = findMemoryRegion(addr);

		if (region == NULL) {
			printDebug("Sysex write to unrecognised address %06x, len %d", MT32EMU_SYSEXMEMADDR(addr), len);
			// FIXME: Real devices may respond differently to a long SysEx that covers adjacent regions.
			break;
		}
		writeMemoryRegion(region, addr, region->getClampedLen(addr, len), sysex);

		Bit32u next = region->next(addr, len);
		if (next == 0) {
			break;
		}
		addr += next;
		sysex += next;
		len -= next;
	}
}